

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

bool __thiscall
helics::TimeDependencies::checkIfReadyForTimeGrant
          (TimeDependencies *this,bool iterating,Time desiredGrantTime,GrantDelayMode delayMode)

{
  anon_class_16_2_bb02ace2 __pred;
  bool bVar1;
  reference pDVar2;
  char in_CL;
  baseType in_RDX;
  byte in_SIL;
  DependencyInfo *dep_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *__range2_2;
  DependencyInfo *dep_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *__range2_1;
  DependencyInfo *dep;
  const_iterator __end2;
  const_iterator __begin2;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *__range2;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_stack_ffffffffffffff48
  ;
  undefined7 in_stack_ffffffffffffff50;
  Time in_stack_ffffffffffffff68;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_70 [2];
  reference local_60;
  DependencyInfo *local_58;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_50 [2];
  baseType local_40;
  char local_38;
  DependencyInfo *local_30;
  DependencyInfo *local_28;
  char local_1a;
  byte local_19;
  TimeRepresentation<count_time<9,_long>_> local_10;
  bool local_1;
  
  local_19 = in_SIL & 1;
  if (local_19 == 0) {
    if (in_CL == '\0') {
      local_50[0]._M_current =
           (DependencyInfo *)
           std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                     (in_stack_ffffffffffffff48);
      local_58 = (DependencyInfo *)
                 std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                           (in_stack_ffffffffffffff48);
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)CONCAT17(in_CL,in_stack_ffffffffffffff50),
                                (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_60 = __gnu_cxx::
                   __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                   ::operator*(local_50);
        if ((((local_60->dependency & 1U) != 0) &&
            (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                               ((TimeRepresentation<count_time<9,_long>_> *)local_60,
                                (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), !bVar1)) &&
           (local_60->connection != SELF)) {
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                            ((TimeRepresentation<count_time<9,_long>_> *)local_60,&local_10);
          if (bVar1) {
            return false;
          }
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==
                            ((TimeRepresentation<count_time<9,_long>_> *)local_60,&local_10);
          if (bVar1) {
            if ((local_60->super_TimeData).mTimeState == time_granted) {
              return false;
            }
            if (((local_60->super_TimeData).mTimeState == time_requested) &&
               ((local_60->nonGranting & 1U) != 0)) {
              return false;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
        ::operator++(local_50);
      }
    }
    else if (in_CL == '\x01') {
      local_70[0]._M_current =
           (DependencyInfo *)
           std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                     (in_stack_ffffffffffffff48);
      std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                (in_stack_ffffffffffffff48);
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)CONCAT17(in_CL,in_stack_ffffffffffffff50),
                                (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
        pDVar2 = __gnu_cxx::
                 __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator*(local_70);
        if ((((pDVar2->dependency & 1U) != 0) &&
            (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                               ((TimeRepresentation<count_time<9,_long>_> *)pDVar2,
                                (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), !bVar1)) &&
           (pDVar2->connection != SELF)) {
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                            ((TimeRepresentation<count_time<9,_long>_> *)pDVar2,&local_10);
          if (bVar1) {
            return false;
          }
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==
                            ((TimeRepresentation<count_time<9,_long>_> *)pDVar2,&local_10);
          if (bVar1) {
            if ((pDVar2->super_TimeData).mTimeState == time_granted) {
              return false;
            }
            if (((pDVar2->super_TimeData).mTimeState == time_requested) &&
               ((pDVar2->nonGranting & 1U) != 0)) {
              return false;
            }
            if ((((pDVar2->super_TimeData).interrupted & 1U) == 0) &&
               (((pDVar2->super_TimeData).delayedTiming & 1U) == 0)) {
              return false;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
        ::operator++(local_70);
      }
    }
    else if (in_CL == '\x02') {
      std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                (in_stack_ffffffffffffff48);
      std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                (in_stack_ffffffffffffff48);
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)CONCAT17(in_CL,in_stack_ffffffffffffff50),
                                (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
        pDVar2 = __gnu_cxx::
                 __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator*((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                              *)&stack0xffffffffffffff70);
        if (((((pDVar2->dependency & 1U) != 0) &&
             (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                                ((TimeRepresentation<count_time<9,_long>_> *)pDVar2,
                                 (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), !bVar1)) &&
            (pDVar2->connection != SELF)) &&
           (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                              ((TimeRepresentation<count_time<9,_long>_> *)pDVar2,&local_10), bVar1)
           ) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
        ::operator++((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      *)&stack0xffffffffffffff70);
      }
    }
    local_1 = true;
  }
  else {
    local_1a = in_CL;
    local_10.internalTimeCode = in_RDX;
    local_28 = (DependencyInfo *)
               std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                         (in_stack_ffffffffffffff48);
    local_30 = (DependencyInfo *)
               std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                         (in_stack_ffffffffffffff48);
    local_40 = local_10.internalTimeCode;
    local_38 = local_1a;
    __pred._8_8_ = in_stack_ffffffffffffff70._M_current;
    __pred.desiredGrantTime.internalTimeCode = in_stack_ffffffffffffff68.internalTimeCode;
    local_1 = std::
              all_of<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::__0>
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,__pred);
  }
  return local_1;
}

Assistant:

bool TimeDependencies::checkIfReadyForTimeGrant(bool iterating,
                                                Time desiredGrantTime,
                                                GrantDelayMode delayMode) const
{
    if (iterating) {
        return std::all_of(dependencies.begin(),
                           dependencies.end(),
                           [desiredGrantTime, delayMode](const auto& dep) {
                               return iteratingTimeGrantCheck(dep, desiredGrantTime, delayMode);
                           });
    }
    switch (delayMode) {
        case GrantDelayMode::NONE:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next < desiredGrantTime) {
                    return false;
                }
                if (dep.next == desiredGrantTime) {
                    if (dep.mTimeState == TimeState::time_granted) {
                        return false;
                    }
                    if (dep.mTimeState == TimeState::time_requested && dep.nonGranting) {
                        return false;
                    }
                }
            }
            break;
        case GrantDelayMode::INTERRUPTED:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next < desiredGrantTime) {
                    return false;
                }
                if (dep.next == desiredGrantTime) {
                    if (dep.mTimeState == TimeState::time_granted) {
                        return false;
                    }
                    if (dep.mTimeState == TimeState::time_requested && dep.nonGranting) {
                        return false;
                    }

                    if (dep.interrupted || dep.delayedTiming) {
                        continue;
                    }
                    return false;
                }
            }
            break;
        case GrantDelayMode::WAITING:
            for (const auto& dep : dependencies) {
                if (!dep.dependency || dep.next >= cBigTime) {
                    continue;
                }
                if (dep.connection == ConnectionType::SELF) {
                    continue;
                }
                if (dep.next <= desiredGrantTime) {
                    return false;
                }
            }
            break;
    }

    return true;
}